

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall
TasGrid::GridSequence::integrate(GridSequence *this,double *q,double *conformal_correction)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  pointer piVar5;
  size_t sVar6;
  long lVar7;
  pointer pdVar8;
  ulong uVar9;
  ulong uVar10;
  int k;
  ulong uVar11;
  pointer piVar12;
  int j;
  ulong uVar13;
  double dVar14;
  allocator_type local_49;
  vector<double,_std::allocator<double>_> w;
  
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  iVar2 = (this->super_BaseCanonicalGrid).num_outputs;
  for (lVar7 = 0; (long)iVar2 * 8 != lVar7; lVar7 = lVar7 + 8) {
    *(undefined8 *)((long)q + lVar7) = 0;
  }
  if (conformal_correction == (double *)0x0) {
    cacheBasisIntegrals(&w,this);
    sVar4 = (this->super_BaseCanonicalGrid).points.num_dimensions;
    piVar5 = (this->super_BaseCanonicalGrid).points.indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    sVar6 = (this->surpluses).stride;
    pdVar8 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (this->super_BaseCanonicalGrid).num_outputs;
    uVar10 = 0;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = uVar10;
    }
    iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
    uVar13 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar13 = uVar10;
    }
    piVar12 = piVar5;
    for (; uVar10 != uVar13; uVar10 = uVar10 + 1) {
      dVar14 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[piVar5[sVar4 * uVar10]];
      for (lVar7 = 1; lVar7 < iVar2; lVar7 = lVar7 + 1) {
        dVar14 = dVar14 * w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[piVar12[lVar7]];
      }
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        q[uVar11] = pdVar8[uVar11] * dVar14 + q[uVar11];
      }
      piVar12 = piVar12 + sVar4;
      pdVar8 = pdVar8 + sVar6;
    }
  }
  else {
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&w,(long)(int)uVar1,&local_49);
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0xc])
              (this,w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    sVar4 = (this->super_BaseCanonicalGrid).values.num_outputs;
    pdVar8 = (this->super_BaseCanonicalGrid).values.values.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar3 = (this->super_BaseCanonicalGrid).num_outputs;
    uVar10 = 0;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = uVar10;
    }
    uVar13 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar13 = uVar10;
    }
    for (; uVar10 != uVar13; uVar10 = uVar10 + 1) {
      w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar10] = conformal_correction[uVar10] *
                 w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        q[uVar11] = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10] * pdVar8[uVar11] + q[uVar11];
      }
      pdVar8 = pdVar8 + sVar4;
    }
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&w);
  return;
}

Assistant:

void GridSequence::integrate(double q[], double *conformal_correction) const{
    int num_points = points.getNumIndexes();
    std::fill(q, q + num_outputs, 0.0);

    // for sequence grids, quadrature weights are expensive,
    // if using simple integration use the basis integral + surpluses, which is fast
    // if using conformal map, then we have to compute the expensive weights
    if (conformal_correction == 0){
        std::vector<double> integ = cacheBasisIntegrals();
        for(int i=0; i<num_points; i++){
            const int* p = points.getIndex(i);
            double w = integ[p[0]];
            const double *s = surpluses.getStrip(i);
            for(int j=1; j<num_dimensions; j++){
                w *= integ[p[j]];
            }
            for(int k=0; k<num_outputs; k++){
                q[k] += w * s[k];
            }
        }
    }else{
        std::vector<double> w(num_points);
        getQuadratureWeights(w.data());
        for(int i=0; i<num_points; i++){
            w[i] *= conformal_correction[i];
            const double *vals = values.getValues(i);
            for(int k=0; k<num_outputs; k++){
                q[k] += w[i] * vals[k];
            }
        }
    }
}